

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O1

void mdct_butterfly_16(float *x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar2 = x[1] - x[9];
  fVar5 = *x - x[8];
  fVar1 = *x + x[8];
  x[8] = fVar1;
  x[9] = x[1] + x[9];
  fVar4 = (fVar2 + fVar5) * 0.70710677;
  *x = fVar4;
  fVar2 = (fVar2 - fVar5) * 0.70710677;
  x[1] = fVar2;
  fVar8 = x[3] - x[0xb];
  fVar3 = x[10] - x[2];
  x[10] = x[10] + x[2];
  x[0xb] = x[3] + x[0xb];
  x[2] = fVar8;
  x[3] = fVar3;
  fVar9 = x[0xc] - x[4];
  fVar5 = x[0xd] - x[5];
  x[0xc] = x[0xc] + x[4];
  x[0xd] = x[0xd] + x[5];
  fVar7 = (fVar9 - fVar5) * 0.70710677;
  x[4] = fVar7;
  fVar6 = (fVar5 + fVar9) * 0.70710677;
  x[5] = fVar6;
  fVar11 = x[0xe] - x[6];
  fVar10 = x[0xf] - x[7];
  fVar9 = x[0xe] + x[6];
  x[0xe] = fVar9;
  fVar5 = x[0xf] + x[7];
  x[0xf] = fVar5;
  x[6] = fVar11;
  x[7] = fVar10;
  x[6] = fVar4 + fVar7 + fVar8 + fVar11;
  x[4] = (fVar8 + fVar11) - (fVar4 + fVar7);
  *x = (fVar6 - fVar2) + (fVar11 - fVar8);
  x[2] = (fVar11 - fVar8) - (fVar6 - fVar2);
  x[3] = (fVar7 - fVar4) + (fVar10 - fVar3);
  x[1] = (fVar10 - fVar3) - (fVar7 - fVar4);
  x[7] = fVar6 + fVar2 + fVar10 + fVar3;
  x[5] = (fVar10 + fVar3) - (fVar6 + fVar2);
  fVar3 = fVar9 + x[10];
  fVar9 = fVar9 - x[10];
  fVar2 = fVar1 + x[0xc];
  fVar1 = x[0xc] - fVar1;
  x[0xe] = fVar3 + fVar2;
  x[0xc] = fVar3 - fVar2;
  fVar2 = x[0xd] - x[9];
  fVar3 = fVar5 - x[0xb];
  x[8] = fVar9 + fVar2;
  x[10] = fVar9 - fVar2;
  fVar2 = x[0xd] + x[9];
  fVar5 = fVar5 + x[0xb];
  x[0xb] = fVar1 + fVar3;
  x[9] = fVar3 - fVar1;
  x[0xf] = fVar2 + fVar5;
  x[0xd] = fVar5 - fVar2;
  return;
}

Assistant:

STIN void mdct_butterfly_16(DATA_TYPE *x){
  REG_TYPE r0     = x[1]  - x[9];
  REG_TYPE r1     = x[0]  - x[8];

           x[8]  += x[0];
           x[9]  += x[1];
           x[0]   = MULT_NORM((r0   + r1) * cPI2_8);
           x[1]   = MULT_NORM((r0   - r1) * cPI2_8);

           r0     = x[3]  - x[11];
           r1     = x[10] - x[2];
           x[10] += x[2];
           x[11] += x[3];
           x[2]   = r0;
           x[3]   = r1;

           r0     = x[12] - x[4];
           r1     = x[13] - x[5];
           x[12] += x[4];
           x[13] += x[5];
           x[4]   = MULT_NORM((r0   - r1) * cPI2_8);
           x[5]   = MULT_NORM((r0   + r1) * cPI2_8);

           r0     = x[14] - x[6];
           r1     = x[15] - x[7];
           x[14] += x[6];
           x[15] += x[7];
           x[6]  = r0;
           x[7]  = r1;

           mdct_butterfly_8(x);
           mdct_butterfly_8(x+8);
}